

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

string * __thiscall
anon_unknown.dwarf_b73b25::FeaturePlaceHolderExpander::ExpandVariable
          (string *__return_storage_ptr__,FeaturePlaceHolderExpander *this,string *variable)

{
  bool bVar1;
  string *variable_local;
  FeaturePlaceHolderExpander *this_local;
  
  if ((this->Library == (string *)0x0) || (bVar1 = std::operator==(variable,"LIBRARY"), !bVar1)) {
    if ((this->LibItem == (string *)0x0) || (bVar1 = std::operator==(variable,"LIB_ITEM"), !bVar1))
    {
      if ((this->LinkItem == (string *)0x0) ||
         (bVar1 = std::operator==(variable,"LINK_ITEM"), !bVar1)) {
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)variable);
      }
      else {
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this->LinkItem);
      }
    }
    else {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this->LibItem);
    }
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this->Library);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ExpandVariable(std::string const& variable) override
  {
    if (this->Library != nullptr && variable == "LIBRARY") {
      return *this->Library;
    }
    if (this->LibItem != nullptr && variable == "LIB_ITEM") {
      return *this->LibItem;
    }
    if (this->LinkItem != nullptr && variable == "LINK_ITEM") {
      return *this->LinkItem;
    }

    return variable;
  }